

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

int enet_host_service(ENetHost *host,ENetEvent *event,enet_uint32 timeout)

{
  undefined4 uVar1;
  undefined4 uVar2;
  enet_uint32 eVar3;
  void *pvVar4;
  _func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *p_Var5;
  int iVar6;
  enet_uint32 eVar7;
  uint uVar8;
  int iVar9;
  ENetChecksumCallback p_Var10;
  size_t sVar11;
  enet_uint8 (*paeVar12) [4096];
  uint uVar13;
  ulong uVar14;
  byte *pbVar15;
  ENetPeer *pEVar16;
  ulong uVar17;
  size_t __n;
  byte *pbVar18;
  int packets;
  enet_uint8 (*paeVar19) [4096];
  enet_uint32 waitCondition;
  enet_uint32 local_bc [3];
  ENetAddress *local_b0;
  ENetEvent *local_a8;
  enet_uint8 (*local_a0) [4096];
  int local_8c;
  ENetBuffer local_88 [3];
  enet_uint8 (*local_50) [4096];
  enet_uint8 (*local_48) [4096];
  ENetBuffer local_40;
  
  if (event != (ENetEvent *)0x0) {
    event->type = ENET_EVENT_TYPE_NONE;
    event->peer = (ENetPeer *)0x0;
    event->packet = (ENetPacket *)0x0;
    iVar6 = enet_protocol_dispatch_incoming_commands(host,event);
    if (iVar6 == -1) {
      return -1;
    }
    if (iVar6 == 1) {
      return 1;
    }
  }
  eVar7 = enet_time_get();
  host->serviceTime = eVar7;
  local_8c = timeout + eVar7;
  paeVar19 = host->packetData;
  local_b0 = &host->receivedAddress;
  local_50 = host->packetData + 1;
  local_a0 = paeVar19;
  do {
    uVar13 = eVar7 - host->bandwidthThrottleEpoch;
    uVar8 = host->bandwidthThrottleEpoch - eVar7;
    if (uVar13 < 86400000) {
      uVar8 = uVar13;
    }
    if (999 < uVar8) {
      enet_host_bandwidth_throttle(host);
    }
    iVar6 = enet_protocol_send_outgoing_commands(host,event,1);
    if (iVar6 == -1) {
      return -1;
    }
    if (iVar6 == 1) {
      return 1;
    }
    iVar6 = 0;
    while( true ) {
      local_40.dataLength = 0x1000;
      local_40.data = paeVar19;
      uVar8 = enet_socket_receive(host->socket,local_b0,&local_40,1);
      if ((int)uVar8 < 0) {
        return -1;
      }
      if (uVar8 == 0) break;
      host->receivedData = *paeVar19;
      uVar14 = (ulong)uVar8;
      host->receivedDataLength = uVar14;
      uVar1 = host->totalReceivedData;
      uVar2 = host->totalReceivedPackets;
      host->totalReceivedData = uVar1 + uVar8;
      host->totalReceivedPackets = uVar2 + 1;
      if (host->intercept == (ENetInterceptCallback)0x0) {
LAB_00105c2f:
        if (3 < uVar14) {
          paeVar12 = (enet_uint8 (*) [4096])host->receivedData;
          uVar8 = *(uint *)*paeVar12;
          uVar13 = uVar8 << 0x18;
          uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                  uVar13 & 0xf0ffffff;
          p_Var10 = host->checksum;
          if (uVar8 == 0xffffff) {
            pEVar16 = (ENetPeer *)0x0;
LAB_00105c67:
            uVar17 = (ulong)(((uVar13 & 0x8000000) >> 0x1a) +
                            (uint)(p_Var10 != (ENetChecksumCallback)0x0) * 4);
            __n = uVar17 + 4;
            local_48 = paeVar12;
            if ((uVar13 & 0x4000000) != 0) {
              pvVar4 = (host->compressor).context;
              if (((pvVar4 == (void *)0x0) ||
                  (p_Var5 = (host->compressor).decompress,
                  p_Var5 == (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0
                  )) || (sVar11 = (*p_Var5)(pvVar4,*paeVar12 + __n,uVar14 - __n,*local_50 + __n,
                                            0x1000 - __n), paeVar12 = local_50, paeVar19 = local_a0,
                        0x1000 - __n <= sVar11 - 1)) goto LAB_00106f70;
              memcpy(local_50,local_48,__n);
              host->receivedData = *paeVar12;
              uVar14 = sVar11 + __n;
              host->receivedDataLength = uVar14;
              p_Var10 = host->checksum;
            }
            if (p_Var10 != (ENetChecksumCallback)0x0) {
              if (pEVar16 == (ENetPeer *)0x0) {
                eVar7 = 0;
              }
              else {
                eVar7 = pEVar16->connectID;
              }
              eVar3 = *(enet_uint32 *)(*paeVar12 + uVar17);
              *(enet_uint32 *)(*paeVar12 + uVar17) = eVar7;
              local_88[0].data = paeVar12;
              local_88[0].dataLength = uVar14;
              eVar7 = (*p_Var10)(local_88,1);
              paeVar19 = local_a0;
              if (eVar7 != eVar3) goto LAB_00106f70;
              uVar14 = host->receivedDataLength;
            }
            if (pEVar16 != (ENetPeer *)0x0) {
              (pEVar16->address).host = (host->receivedAddress).host;
              (pEVar16->address).port = (host->receivedAddress).port;
              pEVar16->incomingDataTotal = pEVar16->incomingDataTotal + (int)uVar14;
            }
            local_a8 = event;
            if ((long)__n < (long)uVar14) {
              pbVar18 = host->receivedData + __n;
              pbVar15 = host->receivedData + uVar14;
              if (pbVar18 + 4 <= pbVar15) {
                uVar8 = *pbVar18 & 0xf;
                if (((0xf3 < (byte)((char)uVar8 - 0xdU)) &&
                    (pbVar18 + commandSizes[uVar8] <= pbVar15)) &&
                   ((pEVar16 != (ENetPeer *)0x0 || ((char)uVar8 == '\x02')))) {
                  *(ushort *)(pbVar18 + 2) =
                       *(ushort *)(pbVar18 + 2) << 8 | *(ushort *)(pbVar18 + 2) >> 8;
                  iVar6 = (*(code *)(&DAT_00108080 +
                                    *(int *)(&DAT_00108080 + (ulong)(uVar8 - 1) * 4)))();
                  return iVar6;
                }
              }
            }
            paeVar19 = local_a0;
            if (event != (ENetEvent *)0x0) goto LAB_00105cb7;
          }
          else if ((ulong)uVar8 < host->peerCount) {
            pEVar16 = host->peer_list[uVar8];
            if ((pEVar16->state != ENET_PEER_STATE_DISCONNECTED) &&
               (pEVar16->state != ENET_PEER_STATE_ZOMBIE)) {
              eVar7 = (pEVar16->address).host;
              if (local_b0->host == eVar7) {
                if ((local_b0->host == 0xffffffff) ||
                   ((host->receivedAddress).port == (pEVar16->address).port)) {
LAB_00106f1d:
                  if ((0xfffffe < pEVar16->outgoingPeerID) ||
                     ((uVar13 & 0x3000000) >> 0x18 == (uint)pEVar16->incomingSessionID))
                  goto LAB_00105c67;
                }
              }
              else if (eVar7 == 0xffffffff) goto LAB_00106f1d;
            }
          }
        }
      }
      else {
        iVar9 = (*host->intercept)(host,event);
        if (iVar9 != 1) {
          if (iVar9 == -1) {
            return -1;
          }
          uVar14 = host->receivedDataLength;
          goto LAB_00105c2f;
        }
        if (event == (ENetEvent *)0x0) goto LAB_00106f70;
LAB_00105cb7:
        if (event->type != ENET_EVENT_TYPE_NONE) {
          return 1;
        }
      }
LAB_00106f70:
      iVar6 = iVar6 + 1;
      if (iVar6 == 0x100) {
        return -1;
      }
    }
    iVar9 = enet_protocol_send_outgoing_commands(host,event,1);
    iVar6 = local_8c;
    if (iVar9 == -1) {
      return -1;
    }
    if (iVar9 == 1) {
      return 1;
    }
    if (event != (ENetEvent *)0x0) {
      iVar9 = enet_protocol_dispatch_incoming_commands(host,event);
      if (iVar9 == -1) {
        return -1;
      }
      if (iVar9 == 1) {
        return 1;
      }
    }
    if (host->serviceTime - iVar6 < 86400000) {
      return 0;
    }
    do {
      eVar7 = enet_time_get();
      host->serviceTime = eVar7;
      if (eVar7 - iVar6 < 86400000) {
        return 0;
      }
      local_bc[0] = 6;
      eVar3 = iVar6 - eVar7;
      if (86399999 < iVar6 - eVar7) {
        eVar3 = eVar7 - iVar6;
      }
      iVar9 = enet_socket_wait(host->socket,local_bc,eVar3);
      if (iVar9 != 0) {
        return -1;
      }
    } while ((local_bc[0] & 4) != 0);
    eVar7 = enet_time_get();
    host->serviceTime = eVar7;
    if ((local_bc[0] & 2) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int
enet_host_service (ENetHost * host, ENetEvent * event, enet_uint32 timeout)
{
    enet_uint32 waitCondition;

    if (event != NULL)
    {
        event -> type = ENET_EVENT_TYPE_NONE;
        event -> peer = NULL;
        event -> packet = NULL;

        switch (enet_protocol_dispatch_incoming_commands (host, event))
        {
        case 1:
            return 1;

        case -1:
#ifdef ENET_DEBUG
            perror ("Error dispatching incoming packets");
#endif

            return -1;

        default:
            break;
        }
    }

    host -> serviceTime = enet_time_get ();
    
    timeout += host -> serviceTime;

    do
    {
       if (ENET_TIME_DIFFERENCE (host -> serviceTime, host -> bandwidthThrottleEpoch) >= ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
         enet_host_bandwidth_throttle (host);

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_receive_incoming_commands (host, event))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error receiving incoming packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       if (event != NULL)
       {
          switch (enet_protocol_dispatch_incoming_commands (host, event))
          {
          case 1:
             return 1;

          case -1:
#ifdef ENET_DEBUG
             perror ("Error dispatching incoming packets");
#endif

             return -1;

          default:
             break;
          }
       }

       if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
         return 0;

       do
       {
          host -> serviceTime = enet_time_get ();

          if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
            return 0;

          waitCondition = ENET_SOCKET_WAIT_RECEIVE | ENET_SOCKET_WAIT_INTERRUPT;

          if (enet_socket_wait (host -> socket, & waitCondition, ENET_TIME_DIFFERENCE (timeout, host -> serviceTime)) != 0)
            return -1;
       }
       while (waitCondition & ENET_SOCKET_WAIT_INTERRUPT);

       host -> serviceTime = enet_time_get ();
    } while (waitCondition & ENET_SOCKET_WAIT_RECEIVE);

    return 0; 
}